

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O2

void __thiscall
Seismogramm<float>::SaveSegY
          (Seismogramm<float> *this,string *path,vector<float,_std::allocator<float>_> *times,
          bool save_empty_headers)

{
  pointer pfVar1;
  int i;
  long lVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  segy_bin_header_data *psVar6;
  uint32 i_3;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1358;
  ofstream additionalf;
  byte abStack_1318 [480];
  ofstream outf;
  byte abStack_1118 [480];
  char empty_trace_header [240];
  char empty_bin_header [400];
  char text_header [3200];
  
  std::ofstream::ofstream(&outf,(path->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_1118[*(long *)(_outf + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"Error in writing SEG-Y file.\n");
LAB_00108dd6:
    exit(1);
  }
  for (lVar2 = 0; lVar2 != 0xc80; lVar2 = lVar2 + 1) {
    text_header[lVar2] = '\0';
  }
  for (lVar2 = 0; lVar2 != 400; lVar2 = lVar2 + 1) {
    empty_bin_header[lVar2] = '\0';
  }
  for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 1) {
    empty_trace_header[lVar2] = '\0';
  }
  std::ostream::write((char *)&outf,(long)text_header);
  swap_header_endian(this);
  psVar6 = (segy_bin_header_data *)empty_bin_header;
  if (!save_empty_headers) {
    psVar6 = &this->header_data;
  }
  std::ostream::write((char *)&outf,(long)psVar6);
  swap_header_endian(this);
  swap_all_trace_headers_endian(this);
  swap_data_endian(this);
  for (__n = 0; __n < (this->header_data).num_of_traces_per_record; __n = __n + 1) {
    pvVar3 = (reference)empty_trace_header;
    if (!save_empty_headers) {
      pvVar3 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::at
                         (&this->trace_header_data,__n);
    }
    std::ostream::write((char *)&outf,(long)pvVar3);
    pvVar4 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::at(&this->data,__n);
    pfVar1 = (pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::at(&this->data,__n);
    std::ostream::write((char *)&outf,(long)pfVar1);
  }
  swap_all_trace_headers_endian(this);
  swap_data_endian(this);
  std::ofstream::close();
  if (save_empty_headers) {
    std::operator+(&local_1358,path,".info.txt");
    std::ofstream::ofstream(&additionalf,local_1358._M_dataplus._M_p,_S_out);
    std::__cxx11::string::~string((string *)&local_1358);
    if ((abStack_1318[*(long *)(_additionalf + -0x18)] & 5) != 0) {
      std::operator<<((ostream *)&std::cout,"Error in writing SEG-Y file(additional info).\n");
      goto LAB_00108dd6;
    }
    poVar5 = std::operator<<((ostream *)&additionalf,"Number of traces = ");
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,(this->header_data).num_of_traces_per_record);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&additionalf,"Number of samples = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->header_data).samples_per_trace);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&additionalf,"Time step(in ms.) = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->header_data).sample_interval);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ofstream::close();
    std::ofstream::~ofstream(&additionalf);
  }
  std::ofstream::~ofstream(&outf);
  return;
}

Assistant:

void Seismogramm<Scalar>::SaveSegY(const std::string& path, const std::vector<Scalar>& times, bool save_empty_headers)
{
    std::ofstream outf (path.data(), std::ios::out | std::ios::binary);
    if (!outf)
    {
        std::cout << "Error in writing SEG-Y file.\n";
        std::exit(1);
    }

    char text_header[3200];
    for (int i = 0; i < 3200; i++)
        text_header[i] = 0;

    char empty_bin_header[sizeof(segy_bin_header_data)];
    for (int i = 0; i < sizeof(segy_bin_header_data); i++)
        empty_bin_header[i] = 0;

    char empty_trace_header[sizeof(segy_trace_header)];
    for (int i = 0; i < sizeof(segy_trace_header); i++)
        empty_trace_header[i] = 0;

    outf.write(text_header, 3200);




    // Saving Binary Header
    swap_header_endian();
    if (save_empty_headers)
        outf.write(reinterpret_cast<char*>(&empty_bin_header), sizeof(empty_bin_header));
    else
        outf.write(reinterpret_cast<char*>(&header_data), sizeof(header_data));
    swap_header_endian();

    // Saving Data and Trace Headers
    swap_all_trace_headers_endian();
    swap_data_endian();
    for (uint32 i = 0; i <  header_data.num_of_traces_per_record; i++)
    {
        if (save_empty_headers)
            outf.write(reinterpret_cast<char*>(&empty_trace_header), sizeof(empty_trace_header));
        else
            outf.write(reinterpret_cast<char*>(&trace_header_data.at(i)), sizeof(trace_header_data.at(i)));

        outf.write(reinterpret_cast<char*>(data.at(i).data()), sizeof(float) * data.at(i).size());
    }
    swap_all_trace_headers_endian();
    swap_data_endian();

    outf.close();

    // saving the most important additional info if headers are set to 0
    if (save_empty_headers)
    {
        std::ofstream additionalf ((path + ".info.txt").data(), std::ios::out);
        if (!additionalf)
        {
            std::cout << "Error in writing SEG-Y file(additional info).\n";
            std::exit(1);
        }
        additionalf << "Number of traces = " <<  header_data.num_of_traces_per_record << std::endl;
        additionalf << "Number of samples = " <<  header_data.samples_per_trace << std::endl;
        additionalf << "Time step(in ms.) = " <<  header_data.sample_interval << std::endl;
        additionalf.close();
    }
}